

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhash.c
# Opt level: O1

int rhash_get_hash_length(uint hash_id)

{
  uint uVar1;
  rhash_info *prVar2;
  uint uVar3;
  
  uVar3 = hash_id & 0x3ff;
  if ((uVar3 & uVar3 - 1) == 0) {
    uVar1 = 0;
    if (uVar3 != 0) {
      for (; (uVar3 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
      }
    }
    prVar2 = rhash_info_table[uVar1].info;
  }
  else {
    prVar2 = (rhash_info *)0x0;
  }
  if (prVar2 != (rhash_info *)0x0) {
    if ((prVar2->flags & 1) == 0) {
      return (int)prVar2->digest_size * 2;
    }
    return (int)((prVar2->digest_size * 8 + 4) / 5);
  }
  return 0;
}

Assistant:

RHASH_API int rhash_get_hash_length(unsigned hash_id)
{
	const rhash_info* info = rhash_info_by_id(hash_id);
	return (int)(info ? (info->flags & F_BS32 ?
		BASE32_LENGTH(info->digest_size) : info->digest_size * 2) : 0);
}